

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Futex.cpp
# Opt level: O2

FutexResult
nativeFutexWaitImpl(void *addr,uint32_t expected,time_point *absSystemTime,time_point *absSteadyTime
                   ,uint32_t waitMask)

{
  int iVar1;
  FutexResult FVar2;
  long lVar3;
  int *piVar4;
  ulong uVar5;
  timespec *ptVar6;
  char *__assertion;
  uint uVar7;
  timespec ts;
  
  if (absSteadyTime != (time_point *)0x0 && absSystemTime != (time_point *)0x0) {
    __assertion = "absSystemTime == nullptr || absSteadyTime == nullptr";
    uVar7 = 0x45;
LAB_0010237f:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/r10a[P]Event-Counts/Futex.cpp"
                  ,uVar7,
                  "FutexResult nativeFutexWaitImpl(const void *, uint32_t, const system_clock::time_point *, const steady_clock::time_point *, uint32_t)"
                 );
  }
  if (absSystemTime == (time_point *)0x0 && absSteadyTime == (time_point *)0x0) {
    uVar7 = 0x89;
    ptVar6 = (timespec *)0x0;
  }
  else {
    if (absSystemTime != (time_point *)0x0) {
      absSteadyTime = (time_point *)absSystemTime;
    }
    uVar7 = (uint)(absSystemTime != (time_point *)0x0) << 8 | 0x89;
    uVar5 = (absSteadyTime->__d).__r;
    if ((long)uVar5 < 1) {
      uVar5 = 0;
    }
    ts.tv_sec = uVar5 / 1000000000;
    ts.tv_nsec = uVar5 % 1000000000;
    ptVar6 = &ts;
  }
  lVar3 = syscall(0xca,addr,(ulong)uVar7,(ulong)expected,ptVar6,0,waitMask);
  if ((int)lVar3 == 0) {
    FVar2 = AWOKEN;
  }
  else {
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    if (iVar1 == 4) {
      FVar2 = INTERRUPTED;
    }
    else {
      if (iVar1 != 0xb) {
        if (iVar1 == 0x6e) {
          if (ptVar6 != (timespec *)0x0) {
            return TIMEDOUT;
          }
          __assertion = "timeout != nullptr";
          uVar7 = 0x68;
        }
        else {
          __assertion = "false";
          uVar7 = 0x6f;
        }
        goto LAB_0010237f;
      }
      FVar2 = VALUE_CHANGED;
    }
  }
  return FVar2;
}

Assistant:

FutexResult nativeFutexWaitImpl(
        const void *addr,
        uint32_t expected,
        system_clock::time_point const *absSystemTime,
        steady_clock::time_point const *absSteadyTime,
        uint32_t waitMask) {
    assert(absSystemTime == nullptr || absSteadyTime == nullptr);

#ifndef PSHARED
    int op = FUTEX_WAIT_BITSET | FUTEX_PRIVATE_FLAG;
#else
    int op = FUTEX_WAIT_BITSET;
#endif
    struct timespec ts;
    struct timespec *timeout = nullptr;

    if (absSystemTime != nullptr) {
        op |= FUTEX_CLOCK_REALTIME;
        ts = timeSpecFromTimePoint(*absSystemTime);
        timeout = &ts;
    } else if (absSteadyTime != nullptr) {
        ts = timeSpecFromTimePoint(*absSteadyTime);
        timeout = &ts;
    }

    // Unlike FUTEX_WAIT, FUTEX_WAIT_BITSET requires an absolute timeout
    // value - http://locklessinc.com/articles/futex_cheat_sheet/
    int rv = syscall(
            __NR_futex,
            addr, /* addr1 */
            op, /* op */
            expected, /* val */
            timeout, /* timeout */
            nullptr, /* addr2 */
            waitMask); /* val3 */

    if (rv == 0) {
        return FutexResult::AWOKEN;
    } else {
        switch (errno) {
            case ETIMEDOUT:
                assert(timeout != nullptr);
                return FutexResult::TIMEDOUT;
            case EINTR:
                return FutexResult::INTERRUPTED;
            case EWOULDBLOCK:
                return FutexResult::VALUE_CHANGED;
            default:
                assert(false);
                // EINVAL, EACCESS, or EFAULT.  EINVAL means there was an invalid
                // op (should be impossible) or an invalid timeout (should have
                // been sanitized by timeSpecFromTimePoint).  EACCESS or EFAULT
                // means *addr points to invalid memory, which is unlikely because
                // the caller should have segfaulted already.  We can either
                // crash, or return a value that lets the process continue for
                // a bit. We choose the latter. VALUE_CHANGED probably turns the
                // caller into a spin lock.
                return FutexResult::VALUE_CHANGED;
        }
    }
}